

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::execBsr<(moira::Instr)33,(moira::Mode)12,(moira::Size)2>(Moira *this,u16 opcode)

{
  u32 uVar1;
  undefined8 in_RAX;
  uint addr;
  u32 addr_00;
  AEStackFrame frame;
  bool error;
  bool local_21;
  
  local_21 = SUB81((ulong)in_RAX >> 0x38,0);
  uVar1 = (this->reg).pc;
  addr = (int)(short)(this->queue).irc + uVar1;
  if ((addr & 1) == 0) {
    (*this->_vptr_Moira[0x19])(this,2);
    addr_00 = (this->reg).field_3.field_0.a[7] - 4;
    (this->reg).field_3.field_0.a[7] = addr_00;
    writeM<(moira::MemSpace)1,(moira::Size)4,0ul>(this,addr_00,uVar1 + 2,&local_21);
    if (local_21 == false) {
      (this->reg).pc = addr;
      fullPrefetch<4ul,0>(this);
    }
    return;
  }
  frame = makeFrame<0ul>(this,addr);
  execAddressError(this,frame,0);
  return;
}

Assistant:

void
Moira::execBsr(u16 opcode)
{
    i16 offset = S == Word ? (i16)queue.irc : (i8)opcode;
    u32 newpc = reg.pc + offset;
    u32 retpc = reg.pc + (S == Word ? 2 : 0);

    // Check for address error
    if (misaligned<Word>(newpc)) {
        execAddressError(makeFrame(newpc));
        return;
    }
    
    // Save return address on stack
    sync(2);
    bool error;
    push <Long> (retpc, error);
    if (error) return;
    
    // Jump to new address
    reg.pc = newpc;

    fullPrefetch<POLLIPL>();
}